

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O0

FunctionBody * __thiscall
Js::JavascriptExceptionObject::GetFunctionBody(JavascriptExceptionObject *this)

{
  bool bVar1;
  JavascriptFunction *pJVar2;
  ParseableFunctionInfo *this_00;
  FunctionBody *pFVar3;
  ParseableFunctionInfo *info;
  JavascriptExceptionObject *this_local;
  
  pJVar2 = JavascriptExceptionContext::ThrowingFunction(&this->exceptionContext);
  if (pJVar2 != (JavascriptFunction *)0x0) {
    pJVar2 = JavascriptExceptionContext::ThrowingFunction(&this->exceptionContext);
    this_00 = JavascriptFunction::GetParseableFunctionInfo(pJVar2);
    bVar1 = FunctionProxy::IsFunctionBody(&this_00->super_FunctionProxy);
    if (bVar1) {
      pFVar3 = FunctionProxy::GetFunctionBody(&this_00->super_FunctionProxy);
      return pFVar3;
    }
  }
  return (FunctionBody *)0x0;
}

Assistant:

FunctionBody* JavascriptExceptionObject::GetFunctionBody() const
    {
        // If it is a throwing function; it must be deserialized
        if (exceptionContext.ThrowingFunction())
        {
            ParseableFunctionInfo *info = exceptionContext.ThrowingFunction()->GetParseableFunctionInfo();
            if (info->IsFunctionBody())
            {
                return info->GetFunctionBody();
            }
        }
        return nullptr;
    }